

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O3

void enter_score(player *p,time_t *death_time)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  ang_file *f;
  ang_file *f_00;
  high_score *scores_00;
  char *pcVar4;
  size_t i;
  long lVar5;
  high_score entry;
  char cur_name [1024];
  char old_name [1024];
  char new_name [1024];
  high_score scores [100];
  high_score local_41d6;
  char local_4158 [1024];
  char local_3d58 [1024];
  char local_3958 [1024];
  char local_3558 [1024];
  high_score local_3158;
  undefined1 auStack_30da [12482];
  
  lVar5 = 0;
  do {
    iVar2 = option_type((int)lVar5);
    if ((iVar2 == 3) && ((p->opts).opt[lVar5] == true)) {
      pcVar4 = "Score not registered for cheaters.";
      goto LAB_001b6326;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2d);
  if ((p->noscore & 10) == 0) {
    if ((p->noscore & 0x20) == 0) {
      if (p->total_winner != 0) {
LAB_001b61d9:
        build_score(&local_41d6,p,p->died_from,death_time);
        scores_00 = &local_3158;
        highscore_read(scores_00,100);
        sVar3 = highscore_where(&local_41d6,scores_00,100);
        memmove(auStack_30da + sVar3 * 0x7e,&local_3158 + sVar3,(99 - sVar3) * 0x7e);
        memcpy(&local_3158 + sVar3,&local_41d6,0x7e);
        path_build(local_3958,0x400,ANGBAND_DIR_SCORES,"scores.old");
        path_build(local_3d58,0x400,ANGBAND_DIR_SCORES,"scores.raw");
        path_build(local_3558,0x400,ANGBAND_DIR_SCORES,"scores.new");
        path_build(local_4158,0x400,ANGBAND_DIR_SCORES,"scores.lok");
        lVar5 = 0;
        do {
          if (scores_00->what[0] == '\0') goto LAB_001b62f6;
          lVar5 = lVar5 + 1;
          scores_00 = scores_00 + 1;
        } while (lVar5 != 100);
        lVar5 = 100;
LAB_001b62f6:
        safe_setuid_grab();
        _Var1 = file_exists(local_4158);
        safe_setuid_drop();
        if (_Var1) {
          pcVar4 = "Lock file in place for scorefile; not writing.";
        }
        else {
          safe_setuid_grab();
          f = file_open(local_4158,MODE_WRITE,FTYPE_RAW);
          if (f != (ang_file *)0x0) {
            file_lock(f);
            safe_setuid_drop();
            safe_setuid_grab();
            f_00 = file_open(local_3558,MODE_WRITE,FTYPE_RAW);
            safe_setuid_drop();
            if (f_00 == (ang_file *)0x0) {
              msg("Failed to open new scorefile for writing.");
              file_close(f);
              safe_setuid_grab();
            }
            else {
              file_write(f_00,local_3158.what,lVar5 * 0x7e);
              file_close(f_00);
              safe_setuid_grab();
              _Var1 = file_exists(local_3958);
              if ((_Var1) && (_Var1 = file_delete(local_3958), !_Var1)) {
                msg("Couldn\'t delete old scorefile");
              }
              _Var1 = file_exists(local_3d58);
              if ((_Var1) && (_Var1 = file_move(local_3d58,local_3958), !_Var1)) {
                msg("Couldn\'t move old scores.raw out of the way");
              }
              _Var1 = file_move(local_3558,local_3d58);
              if (!_Var1) {
                msg("Couldn\'t rename new scorefile to scores.raw");
              }
              file_close(f);
            }
            file_delete(local_4158);
            safe_setuid_drop();
            return;
          }
          safe_setuid_drop();
          pcVar4 = "Failed to create lock for scorefile; not writing.";
        }
        msg(pcVar4);
        return;
      }
      iVar2 = strcmp(p->died_from,"Interrupting");
      if (iVar2 == 0) {
        pcVar4 = "Score not registered due to interruption.";
      }
      else {
        iVar2 = strcmp(p->died_from,"Retiring");
        if (iVar2 != 0) goto LAB_001b61d9;
        pcVar4 = "Score not registered due to retiring.";
      }
    }
    else {
      pcVar4 = "Score not registered for borgs.";
    }
  }
  else {
    pcVar4 = "Score not registered for wizards.";
  }
LAB_001b6326:
  msg(pcVar4);
  event_signal(EVENT_MESSAGE_FLUSH);
  return;
}

Assistant:

void enter_score(const struct player *p, const time_t *death_time)
{
	int j;

	/* Cheaters are not scored */
	for (j = 0; j < OPT_MAX; ++j) {
		if (option_type(j) != OP_SCORE)
			continue;
		if (!p->opts.opt[j])
			continue;

		msg("Score not registered for cheaters.");
		event_signal(EVENT_MESSAGE_FLUSH);
		return;
	}

	/* Add a new entry, if allowed */
	if (p->noscore & (NOSCORE_WIZARD | NOSCORE_DEBUG)) {
		msg("Score not registered for wizards.");
		event_signal(EVENT_MESSAGE_FLUSH);
#ifdef ALLOW_BORG
#ifndef SCORE_BORGS
	}	else if (p->noscore & (NOSCORE_BORG)) {
		msg("Score not registered for borgs.");
		event_signal(EVENT_MESSAGE_FLUSH);
#endif
#endif
	} else if (!p->total_winner && streq(p->died_from, "Interrupting")) {
		msg("Score not registered due to interruption.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else if (!p->total_winner && streq(p->died_from, "Retiring")) {
		msg("Score not registered due to retiring.");
		event_signal(EVENT_MESSAGE_FLUSH);
	} else {
		struct high_score entry;
		struct high_score scores[MAX_HISCORES];

		build_score(&entry, p, p->died_from, death_time);

		highscore_read(scores, N_ELEMENTS(scores));
		highscore_add(&entry, scores, N_ELEMENTS(scores));
		highscore_write(scores, N_ELEMENTS(scores));
	}

	/* Success */
	return;
}